

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondEpsGen.h
# Opt level: O2

bool __thiscall
covenant::CondEpsGen<covenant::Sym>::addTrans(CondEpsGen<covenant::Sym> *this,int qi,int c,int qj)

{
  bool bVar1;
  _Rb_tree_node_base *p_Var2;
  emplace_return eVar3;
  int local_3c;
  anon_struct_12_3_f74832de local_38;
  
  local_38.end = qj;
  local_38.start = qi;
  local_3c = c;
  local_38.s = c;
  std::
  vector<covenant::CondEpsGen<covenant::Sym>::prod_info,_std::allocator<covenant::CondEpsGen<covenant::Sym>::prod_info>_>
  ::emplace_back<covenant::CondEpsGen<covenant::Sym>::prod_info>(&this->decisions,&local_38);
  eVar3 = boost::unordered::detail::
          table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
          ::try_emplace_unique<int_const&>
                    ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,std::set<int,std::less<int>,std::allocator<int>>>>,int,std::set<int,std::less<int>,std::allocator<int>>,boost::hash<int>,std::equal_to<int>>>
                      *)&this->digest->term_prods,&local_3c);
  for (p_Var2 = *(_Rb_tree_node_base **)
                 ((long)&((eVar3.first.node_.node_)->value_base_).data_.data_ + 0x20);
      p_Var2 != (_Rb_tree_node_base *)
                ((long)&((eVar3.first.node_.node_)->value_base_).data_.data_ + 0x10);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    addProd(this,qi,p_Var2[1]._M_color,qj);
  }
  bVar1 = update_prods(this);
  return bVar1;
}

Assistant:

bool addTrans(int qi, int c, int qj)
    {
      // Update the automaton with a new transition.
      // Not presently checking if p[qi -> qj] alreacy
      // exists.
      decisions.push_back(mk_prod(qi, c, qj));
      
      set<int>& sing(digest.term_prods[c]);
      
      set<int>::iterator it;
      for(it = sing.begin(); it != sing.end(); ++it)
      {
        addProd(qi, *it, qj);
      }
      return update_prods();
    }